

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O3

int erkStep_AccessStepMem(ARKodeMem ark_mem,char *fname,ARKodeERKStepMem *step_mem)

{
  int iVar1;
  
  if ((ARKodeERKStepMem)ark_mem->step_mem == (ARKodeERKStepMem)0x0) {
    iVar1 = -0x15;
    arkProcessError(ark_mem,-0x15,0x309,fname,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_erkstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    *step_mem = (ARKodeERKStepMem)ark_mem->step_mem;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int erkStep_AccessStepMem(ARKodeMem ark_mem, const char* fname,
                          ARKodeERKStepMem* step_mem)
{
  /* access ARKodeERKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_ERKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  *step_mem = (ARKodeERKStepMem)ark_mem->step_mem;
  return (ARK_SUCCESS);
}